

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O3

void * __thiscall ncnn::PoolAllocator::fastMalloc(PoolAllocator *this,size_t size)

{
  Mutex *__mutex;
  size_t *psVar1;
  _List_node_base *p_Var2;
  int iVar3;
  _List_node_base *in_RAX;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  void *ptr;
  _List_node_base *local_38;
  
  __mutex = &this->budgets_lock;
  local_38 = in_RAX;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  p_Var4 = (this->budgets).
           super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var4 != (_List_node_base *)&this->budgets) {
    do {
      p_Var2 = p_Var4[1]._M_next;
      if ((size <= p_Var2) && ((long)p_Var2 * (ulong)this->size_compare_ratio >> 8 <= size)) {
        p_Var5 = p_Var4[1]._M_prev;
        psVar1 = &(this->budgets).
                  super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var4,0x20);
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        pthread_mutex_lock((pthread_mutex_t *)&this->payouts_lock);
        p_Var4 = (_List_node_base *)operator_new(0x20);
        p_Var4[1]._M_next = p_Var2;
        p_Var4[1]._M_prev = p_Var5;
        std::__detail::_List_node_base::_M_hook(p_Var4);
        psVar1 = &(this->payouts).
                  super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        goto LAB_00112660;
      }
      p_Var4 = p_Var4->_M_next;
    } while (p_Var4 != (_List_node_base *)&this->budgets);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  local_38 = (_List_node_base *)0x0;
  iVar3 = posix_memalign(&local_38,0x10,size);
  p_Var5 = (_List_node_base *)0x0;
  if (iVar3 == 0) {
    p_Var5 = local_38;
  }
  pthread_mutex_lock((pthread_mutex_t *)&this->payouts_lock);
  p_Var4 = (_List_node_base *)operator_new(0x20);
  p_Var4[1]._M_next = (_List_node_base *)size;
  p_Var4[1]._M_prev = p_Var5;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(this->payouts).
            super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
LAB_00112660:
  pthread_mutex_unlock((pthread_mutex_t *)&this->payouts_lock);
  return p_Var5;
}

Assistant:

void* PoolAllocator::fastMalloc(size_t size)
{
    budgets_lock.lock();

    // find free budget
    std::list< std::pair<size_t, void*> >::iterator it = budgets.begin();
    for (; it != budgets.end(); it++)
    {
        size_t bs = it->first;

        // size_compare_ratio ~ 100%
        if (bs >= size && ((bs * size_compare_ratio) >> 8) <= size)
        {
            void* ptr = it->second;

            budgets.erase(it);

            budgets_lock.unlock();

            payouts_lock.lock();

            payouts.push_back(std::make_pair(bs, ptr));

            payouts_lock.unlock();

            return ptr;
        }
    }

    budgets_lock.unlock();

    // new
    void* ptr = ncnn::fastMalloc(size);

    payouts_lock.lock();

    payouts.push_back(std::make_pair(size, ptr));

    payouts_lock.unlock();

    return ptr;
}